

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgp.cpp
# Opt level: O2

bool send_update_with_nlri(bgp_peer *peer,attributes *attr,uint32_t prefix,uint8_t prefix_len)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  undefined4 local_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  ushort local_408;
  undefined1 local_406;
  ushort local_403;
  
  memset(&local_408,0,0x3d8);
  sVar2 = encode_bgp_path_attributes_to_buffer(peer,attr,(uchar *)&local_418,0x17);
  local_403 = (ushort)sVar2 << 8 | (ushort)sVar2 >> 8;
  iVar1 = (int)sVar2;
  uVar3 = (ulong)(iVar1 + 0x18);
  *(uint8_t *)((long)&local_418 + (ulong)(iVar1 + 0x17U & 0xffff)) = prefix_len;
  if (prefix_len < 9) {
    *(char *)((long)&local_418 + (uVar3 & 0xffff)) = (char)prefix;
    uVar3 = (ulong)(iVar1 + 0x19);
  }
  else if (prefix_len < 0x11) {
    *(short *)((long)&local_418 + (uVar3 & 0xffff)) = (short)prefix;
    uVar3 = (ulong)(iVar1 + 0x1a);
  }
  else if (prefix_len < 0x19) {
    *(char *)((long)&local_418 + (uVar3 & 0xffff) + 2) = (char)(prefix >> 0x10);
    *(short *)((long)&local_418 + (uVar3 & 0xffff)) = (short)prefix;
    uVar3 = (ulong)(iVar1 + 0x1b);
  }
  else if (prefix_len < 0x21) {
    *(uint32_t *)((long)&local_418 + (uVar3 & 0xffff)) = prefix;
    uVar3 = (ulong)(iVar1 + 0x1c);
  }
  local_408 = (ushort)uVar3 << 8 | (ushort)uVar3 >> 8;
  local_418 = 0xffffffff;
  uStack_414 = 0xffffffff;
  uStack_410 = 0xffffffff;
  uStack_40c = 0xffffffff;
  local_406 = 2;
  iVar1 = (**peer->_vptr_bgp_peer)(peer,&local_418,uVar3 & 0xffff);
  return SUB41(iVar1,0);
}

Assistant:

bool send_update_with_nlri(bgp_peer* peer, attributes* attr, uint32_t prefix, uint8_t prefix_len){
    unsigned char buffer[1000];
    memset(buffer, 0, 1000);
    uint16_t pointer = BGP_HEADER_SIZE;

    buffer[pointer++] = 0; // withdraw routes length (2byte)
    buffer[pointer++] = 0;

    pointer += 2;
    size_t attr_size = encode_bgp_path_attributes_to_buffer(peer, attr, buffer, pointer);
    size_t attr_size_ordered = htons(attr_size);
    memcpy(&buffer[pointer-2], &attr_size_ordered, 2);
    pointer += attr_size;

    buffer[pointer++] = prefix_len;
    if(prefix_len <= 8){
        memcpy(&buffer[pointer], &prefix, 1);
        pointer += 1;
    }else if(prefix_len <= 16){
        memcpy(&buffer[pointer], &prefix, 2);
        pointer += 2;
    }else if(prefix_len <= 24){
        memcpy(&buffer[pointer], &prefix, 3);
        pointer += 3;
    }else if(prefix_len <= 32){
        memcpy(&buffer[pointer], &prefix, 4);
        pointer += 4;
    }

    bgp_header header;
    memset(header.maker, 0xff, 16);
    header.type = UPDATE;
    header.length = htons(pointer);
    memcpy(&buffer[0], &header, BGP_HEADER_SIZE);
    //hex_dump(buffer, pointer);
    return peer->send(buffer, pointer);
}